

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

void __thiscall Client::Bind(Client *this,IPAddress *addr,uint16_t port)

{
  uint uVar1;
  int iVar2;
  undefined8 *puVar3;
  int yes;
  sockaddr local_28;
  
  yes = 1;
  setsockopt(((this->impl)._M_t.
              super___uniq_ptr_impl<Client::impl_,_std::default_delete<Client::impl_>_>._M_t.
              super__Tuple_impl<0UL,_Client::impl__*,_std::default_delete<Client::impl_>_>.
              super__Head_base<0UL,_Client::impl__*,_false>._M_head_impl)->sock,1,2,&yes,4);
  local_28.sa_data[6] = '\0';
  local_28.sa_data[7] = '\0';
  local_28.sa_data[8] = '\0';
  local_28.sa_data[9] = '\0';
  local_28.sa_data[10] = '\0';
  local_28.sa_data[0xb] = '\0';
  local_28.sa_data[0xc] = '\0';
  local_28.sa_data[0xd] = '\0';
  local_28.sa_family = 2;
  uVar1 = addr->address;
  local_28.sa_data._2_4_ =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  local_28.sa_data._0_2_ = port << 8 | port >> 8;
  iVar2 = bind(((this->impl)._M_t.
                super___uniq_ptr_impl<Client::impl_,_std::default_delete<Client::impl_>_>._M_t.
                super__Tuple_impl<0UL,_Client::impl__*,_std::default_delete<Client::impl_>_>.
                super__Head_base<0UL,_Client::impl__*,_false>._M_head_impl)->sock,&local_28,0x10);
  if (iVar2 != -1) {
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
  OSErrorString();
  puVar3[1] = ErrorBuf;
  *puVar3 = &PTR__exception_001bcc38;
  __cxa_throw(puVar3,&Socket_BindFailed::typeinfo,std::exception::~exception);
}

Assistant:

void Client::Bind(const IPAddress &addr, uint16_t port)
{
	sockaddr_in sin;
	uint16_t portn = htons(port);

#ifdef WIN32
	BOOL yes = 1;
	setsockopt(this->impl->sock, SOL_SOCKET, SO_REUSEADDR, reinterpret_cast<const char*>(&yes), sizeof(BOOL));
#else
	int yes = 1;
	setsockopt(this->impl->sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof(int));
#endif

	std::memset(&sin, 0, sizeof(sin));
	sin.sin_family = AF_INET;
	sin.sin_addr.s_addr = htonl(addr);
	sin.sin_port = portn;

	if (bind(this->impl->sock, reinterpret_cast<sockaddr *>(&sin), sizeof(sin)) == SOCKET_ERROR)
	{
		throw Socket_BindFailed(OSErrorString());
	}
}